

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

WriteStream * __thiscall
soul::PoolAllocator::
allocate<soul::heart::WriteStream,soul::CodeLocation_const&,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Expression&>
          (PoolAllocator *this,CodeLocation *args,OutputDeclaration *args_1,
          pool_ptr<soul::heart::Expression> *args_2,Expression *args_3)

{
  PoolItem *pPVar1;
  CodeLocation local_48;
  pool_ptr<soul::heart::Expression> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x38);
  local_48.sourceCode.object = (args->sourceCode).object;
  if (local_48.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.data = (args->location).data;
  local_38 = (pool_ptr<soul::heart::Expression>)args_2->object;
  heart::WriteStream::WriteStream((WriteStream *)&pPVar1->item,&local_48,args_1,&local_38,args_3);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::WriteStream,_const_soul::CodeLocation_&,_soul::heart::OutputDeclaration_&,_soul::pool_ptr<soul::heart::Expression>,_soul::heart::Expression_&>
       ::anon_class_1_0_00000001::__invoke;
  return (WriteStream *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }